

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<double>::DecomposeColumn
          (TPZSkylMatrix<double> *this,int64_t col,int64_t prevcol,
          list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  double **ppdVar2;
  double *pdVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double dVar8;
  
  ppdVar2 = (this->fElem).fStore;
  pdVar3 = ppdVar2[prevcol];
  pdVar7 = ppdVar2[col];
  lVar6 = (prevcol - ((long)ppdVar2[prevcol + 1] - (long)pdVar3 >> 3)) + 1;
  lVar5 = (col - ((long)ppdVar2[col + 1] - (long)pdVar7 >> 3)) + 1;
  if (lVar5 < lVar6) {
    lVar5 = lVar6;
  }
  if (prevcol < lVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error condition\n",0x10);
    std::ostream::flush();
    return;
  }
  if (prevcol == lVar5) {
    pdVar7 = pdVar7 + (col - lVar5);
    dVar8 = 0.0;
  }
  else {
    pdVar7 = pdVar7 + col;
    pdVar3 = pdVar3 + prevcol;
    lVar6 = prevcol * -8;
    dVar8 = 0.0;
    do {
      dVar8 = dVar8 + pdVar3[-lVar5] * pdVar7[-lVar5];
      pdVar7 = pdVar7 + -1;
      pdVar3 = pdVar3 + -1;
      lVar6 = lVar6 + 8;
    } while (-lVar6 != lVar5 * 8);
    pdVar7 = pdVar7 + -lVar5;
    pdVar3 = pdVar3 + -lVar5;
  }
  dVar8 = *pdVar7 - dVar8;
  *pdVar7 = dVar8;
  if (pdVar3 == pdVar7) {
    if (ABS(dVar8) < 1e-10) {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = (_List_node_base *)col;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      dVar8 = 1.0;
    }
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
  }
  else {
    dVar8 = dVar8 / *pdVar3;
  }
  *pdVar7 = dVar8;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol,std::list<int64_t> &singular){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        TVar pivot = *run2;
        if ( fabs(pivot) < fabs((TVar)1.e-10) ) {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "equation " << col << " is singular pivot " << pivot;
            LOGPZ_WARN(logger,sout.str())
#endif
            singular.push_back(col);
            pivot = 1.;
        }
        
        *run2=sqrt(pivot);
    }
    
}